

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

int __thiscall dgrminer::PartialUnion::getLabelEncoding(PartialUnion *this,string *label)

{
  iterator iVar1;
  _Base_ptr __y;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  pStack_48;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->labelEncoding)._M_t,label);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->labelEncoding)._M_t._M_impl.super__Rb_tree_header)
  {
    this->number_of_labels = this->number_of_labels + 1;
    __y = (_Base_ptr)&this->number_of_labels;
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_true>
              (&pStack_48,label,(int *)__y);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->labelEncoding,&pStack_48);
    std::__cxx11::string::~string((string *)&pStack_48);
  }
  else {
    __y = iVar1._M_node + 2;
  }
  return __y->_M_color;
}

Assistant:

int PartialUnion::getLabelEncoding(string label)
	{
		auto it = labelEncoding.find(label);
		if (it != labelEncoding.end()) {
			return it->second;
		}
		else {
			(number_of_labels)++;
			labelEncoding.insert(std::make_pair(label, number_of_labels));
			return number_of_labels;
		}
	}